

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QAdoptedThread::QAdoptedThread(QAdoptedThread *this,QThreadData *data)

{
  EVP_PKEY_CTX *ctx;
  Type pvVar1;
  QThreadPrivate *pQVar2;
  long in_RSI;
  QAdoptedThread *in_RDI;
  long in_FS_OFFSET;
  HANDLE id;
  QString *in_stack_ffffffffffffff78;
  QThreadData *in_stack_ffffffffffffff80;
  QThreadPrivate *in_stack_ffffffffffffff88;
  QThread *in_stack_ffffffffffffff90;
  QBindingStatus *in_stack_ffffffffffffffb0;
  QThreadData *in_stack_ffffffffffffffb8;
  EVP_PKEY_CTX *this_00;
  QThreadPrivate *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  operator_new(0xd0);
  QThreadPrivate::QThreadPrivate(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  QThread::QThread(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (QObject *)in_stack_ffffffffffffff80);
  (in_RDI->super_QThread).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_00be85a8;
  QThreadData::deref(in_stack_ffffffffffffff80);
  *(undefined1 *)(in_RSI + 0x8e) = 1;
  ctx = (EVP_PKEY_CTX *)QThread::currentThreadId();
  this_00 = ctx;
  QBasicAtomicPointer<void>::storeRelaxed
            ((QBasicAtomicPointer<void> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pvVar1 = QBasicAtomicPointer<void>::loadAcquire((QBasicAtomicPointer<void> *)0x555fa4);
  if (pvVar1 == (Type)0x0) {
    QBasicAtomicPointer<QThread>::storeRelease
              ((QBasicAtomicPointer<QThread> *)in_stack_ffffffffffffff80,
               (Type)in_stack_ffffffffffffff78);
    QBasicAtomicPointer<void>::storeRelaxed
              ((QBasicAtomicPointer<void> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pQVar2 = d_func((QAdoptedThread *)0x555fda);
    ctx = local_20;
    Qt::Literals::StringLiterals::operator____s((char16_t *)ctx,(size_t)pQVar2);
    QObjectPrivate::setObjectNameWithoutBindings
              ((QObjectPrivate *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QString::~QString((QString *)0x556015);
  }
  pQVar2 = d_func((QAdoptedThread *)0x55607c);
  pQVar2->threadState = Running;
  init(in_RDI,ctx);
  d_func((QAdoptedThread *)0x556099);
  QtPrivate::getBindingStatus();
  QtPrivate::BindingStatusOrList::setStatusAndClearList
            ((BindingStatusOrList *)this_00,in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAdoptedThread::QAdoptedThread(QThreadData *data)
    : QThread(*new QThreadPrivate(data))
{
    // avoid a cyclic reference count: QThreadData owns this QAdoptedThread
    // object but QObject's constructor increased the count
    data->deref();

    data->isAdopted = true;
    Qt::HANDLE id = QThread::currentThreadId();
    data->threadId.storeRelaxed(id);
    if (!QCoreApplicationPrivate::theMainThreadId.loadAcquire()) {
        // we are the main thread
        QCoreApplicationPrivate::theMainThread.storeRelease(this);
        QCoreApplicationPrivate::theMainThreadId.storeRelaxed(id);

        // bypass the bindings because nothing can be listening yet
        d_func()->setObjectNameWithoutBindings(u"Qt mainThread"_s);
    }

    // thread should be running and not finished for the lifetime
    // of the application (even if QCoreApplication goes away)
#if QT_CONFIG(thread)
    d_func()->threadState = QThreadPrivate::Running;
    init();
    d_func()->m_statusOrPendingObjects.setStatusAndClearList(
                QtPrivate::getBindingStatus({}));
#endif
    // fprintf(stderr, "new QAdoptedThread = %p\n", this);
}